

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O1

char * flatcc_json_parser_array_start(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  char *buf_00;
  char *pcVar1;
  
  if ((buf == end) || (*buf != '[')) {
    *more = 0;
    pcVar1 = flatcc_json_parser_set_error(ctx,buf,end,0x16);
    return pcVar1;
  }
  pcVar1 = buf + 1;
  if ((long)end - (long)pcVar1 < 2) {
LAB_0010f286:
    pcVar1 = flatcc_json_parser_space_ext(ctx,pcVar1,end);
  }
  else if (*pcVar1 < '!') {
    if ((*pcVar1 != ' ') || (buf[2] < '!')) goto LAB_0010f286;
    pcVar1 = buf + 2;
  }
  if ((pcVar1 == end) || (*pcVar1 != ']')) {
    *more = 1;
    buf_00 = pcVar1;
  }
  else {
    *more = 0;
    buf_00 = pcVar1 + 1;
    if ((long)end - (long)buf_00 < 2) {
LAB_0010f2da:
      pcVar1 = flatcc_json_parser_space_ext(ctx,buf_00,end);
      return pcVar1;
    }
    if (*buf_00 < '!') {
      if ((*buf_00 != ' ') || (pcVar1[2] < '!')) goto LAB_0010f2da;
      buf_00 = pcVar1 + 2;
    }
  }
  return buf_00;
}

Assistant:

static inline const char *flatcc_json_parser_array_start(flatcc_json_parser_t *ctx, const char *buf, const char *end, int *more)
{
    if (buf == end || *buf != '[') {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_expected_array);
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf != end && *buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
    *more = 1;
    return buf;
}